

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float __thiscall lda::powf(lda *this,float __x,float __y)

{
  lda_math_mode lVar1;
  ostream *this_00;
  float local_4;
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    local_4 = ldamath::powf<float,(lda_math_mode)0>(0.0,3.09122e-39);
  }
  else if (lVar1 == USE_PRECISE) {
    local_4 = ldamath::powf<float,(lda_math_mode)1>(0.0,3.091185e-39);
  }
  else {
    if (lVar1 != USE_FAST_APPROX) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "lda::powf: Trampled or invalid math mode, aborting");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_4 = ldamath::powf<float,(lda_math_mode)2>(0.0,3.09115e-39);
  }
  return local_4;
}

Assistant:

float lda::powf(float x, float p)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::powf FAST_APPROX ";
      return ldamath::powf<float, USE_FAST_APPROX>(x, p);
    case USE_PRECISE:
      // std::cerr << "lda::powf PRECISE ";
      return ldamath::powf<float, USE_PRECISE>(x, p);
    case USE_SIMD:
      // std::cerr << "lda::powf SIMD ";
      return ldamath::powf<float, USE_SIMD>(x, p);
    default:
      std::cerr << "lda::powf: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}